

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O2

uint64_t __thiscall
adios2::core::engine::BP5Writer::WriteMetadata
          (BP5Writer *this,vector<char,_std::allocator<char>_> *ContigMetaData,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *SizeVector,
          vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *AttributeBlocks)

{
  TransportMan *this_00;
  char *buffer;
  pointer piVar1;
  pointer puVar2;
  pointer puVar3;
  long lVar4;
  iovec *b;
  long lVar5;
  pointer piVar6;
  size_t a;
  ulong uVar7;
  pointer puVar8;
  size_t size;
  pointer pcVar9;
  unsigned_long local_a8;
  long local_a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> AttrSizeVector;
  string local_70;
  string local_50;
  
  puVar2 = (SizeVector->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar4 = 0;
  puVar3 = (SizeVector->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (puVar8 = puVar3; puVar8 != puVar2; puVar8 = puVar8 + 1) {
    lVar4 = lVar4 + *puVar8;
  }
  AttrSizeVector.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  AttrSizeVector.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  AttrSizeVector.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar5 = (long)puVar2 + (lVar4 - (long)puVar3);
  lVar4 = 8;
  local_a0 = lVar5;
  for (uVar7 = 0; uVar7 < (ulong)((long)puVar2 - (long)puVar3 >> 3); uVar7 = uVar7 + 1) {
    piVar6 = (AttributeBlocks->
             super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar7 < (ulong)((long)(AttributeBlocks->
                              super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)piVar6 >> 4)) {
      lVar5 = lVar5 + *(long *)((long)&piVar6->iov_base + lVar4) + 8;
      local_a0 = lVar5;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&AttrSizeVector,(value_type_conflict9 *)((long)&piVar6->iov_base + lVar4));
    }
    else {
      local_a8 = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&AttrSizeVector,&local_a8);
      lVar5 = lVar5 + 8;
      local_a0 = lVar5;
    }
    puVar3 = (SizeVector->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
             .super__Vector_impl_data._M_start;
    puVar2 = (SizeVector->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
             .super__Vector_impl_data._M_finish;
    lVar4 = lVar4 + 0x10;
  }
  this_00 = &this->m_FileMetadataManager;
  transportman::TransportMan::WriteFiles(this_00,(char *)&local_a0,8,-1);
  puVar3 = (SizeVector->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  transportman::TransportMan::WriteFiles
            (this_00,(char *)puVar3,
             (long)(SizeVector->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar3,-1);
  size = (long)AttrSizeVector.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)AttrSizeVector.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
  transportman::TransportMan::WriteFiles
            (this_00,(char *)AttrSizeVector.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start,size,-1);
  uVar7 = (long)AttrSizeVector.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (size - (long)AttrSizeVector.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start);
  std::__cxx11::string::string((string *)&local_50,"MetadataBlockWrite",(allocator *)&local_a8);
  profiling::JSONProfiler::Start(&this->m_Profiler,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  buffer = (ContigMetaData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  transportman::TransportMan::WriteFiles
            (this_00,buffer,
             (long)(ContigMetaData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)buffer,-1);
  std::__cxx11::string::string((string *)&local_70,"MetadataBlockWrite",(allocator *)&local_a8);
  profiling::JSONProfiler::Stop(&this->m_Profiler,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  pcVar9 = (ContigMetaData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_finish +
           ((uVar7 & 0xfffffffffffffff8) -
           (long)(ContigMetaData->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start) + 8;
  piVar1 = (AttributeBlocks->
           super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar6 = (AttributeBlocks->
                super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>).
                _M_impl.super__Vector_impl_data._M_start; piVar6 != piVar1; piVar6 = piVar6 + 1) {
    if ((char *)piVar6->iov_base != (char *)0x0) {
      transportman::TransportMan::WriteFiles(this_00,(char *)piVar6->iov_base,piVar6->iov_len,-1);
      pcVar9 = pcVar9 + piVar6->iov_len;
    }
  }
  transportman::TransportMan::FlushFiles(this_00,-1);
  this->m_MetaDataPos = (uint64_t)(pcVar9 + this->m_MetaDataPos);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&AttrSizeVector.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return (uint64_t)pcVar9;
}

Assistant:

uint64_t BP5Writer::WriteMetadata(const std::vector<char> &ContigMetaData,
                                  const std::vector<size_t> &SizeVector,
                                  const std::vector<core::iovec> &AttributeBlocks)
{
    size_t MDataTotalSize = std::accumulate(SizeVector.begin(), SizeVector.end(), size_t(0));
    uint64_t MetaDataSize = 0;
    std::vector<uint64_t> AttrSizeVector;

    MDataTotalSize += SizeVector.size() * sizeof(size_t);
    for (size_t a = 0; a < SizeVector.size(); a++)
    {
        if (a < AttributeBlocks.size())
        {
            auto &b = AttributeBlocks[a];
            MDataTotalSize += sizeof(uint64_t) + b.iov_len;
            AttrSizeVector.push_back(b.iov_len);
        }
        else
        {
            AttrSizeVector.push_back(0);
            MDataTotalSize += sizeof(uint64_t);
        }
    }
    MetaDataSize = 0;
    m_FileMetadataManager.WriteFiles((char *)&MDataTotalSize, sizeof(uint64_t));
    MetaDataSize += sizeof(uint64_t);
    m_FileMetadataManager.WriteFiles((char *)SizeVector.data(),
                                     sizeof(uint64_t) * SizeVector.size());
    MetaDataSize += sizeof(uint64_t) * AttrSizeVector.size();
    m_FileMetadataManager.WriteFiles((char *)AttrSizeVector.data(),
                                     sizeof(uint64_t) * AttrSizeVector.size());
    MetaDataSize += sizeof(uint64_t) * AttrSizeVector.size();
    m_Profiler.Start("MetadataBlockWrite");
    m_FileMetadataManager.WriteFiles(ContigMetaData.data(), ContigMetaData.size());
    m_Profiler.Stop("MetadataBlockWrite");
    MetaDataSize += ContigMetaData.size();

    for (auto &b : AttributeBlocks)
    {
        if (!b.iov_base)
            continue;
        m_FileMetadataManager.WriteFiles((char *)b.iov_base, b.iov_len);
        MetaDataSize += b.iov_len;
    }

    m_FileMetadataManager.FlushFiles();

    m_MetaDataPos += MetaDataSize;
    return MetaDataSize;
}